

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string_t *
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::to_unicode(string_t *__return_storage_ptr__,size_t codepoint1,size_t codepoint2)

{
  invalid_argument *this;
  out_of_range *this_00;
  char *local_28;
  size_t codepoint;
  size_t codepoint2_local;
  size_t codepoint1_local;
  string_t *result;
  
  local_28 = (char *)codepoint1;
  if ((0xd7ff < codepoint1) && (codepoint1 < 0xdc00)) {
    if ((codepoint2 < 0xdc00) || (0xdfff < codepoint2)) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"missing or wrong low surrogate");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_28 = (char *)(codepoint1 * 0x400 + codepoint2 + -0x35fdc00);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_28 < (char *)0x80) {
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  }
  else if (local_28 < (char *)0x800) {
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  }
  else if (local_28 < (char *)0x10000) {
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  }
  else {
    if ("KSt6vectorIN8nlohmann10basic_jsonISt3mapS_NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEblmdSaNS0_14adl_serializerEEESaISA_EE8max_sizeEv"
        < local_28) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"code points above 0x10FFFF are invalid");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  }
  return __return_storage_ptr__;
}

Assistant:

static string_t to_unicode(const std::size_t codepoint1,
                                   const std::size_t codepoint2 = 0)
        {
            // calculate the code point from the given code points
            std::size_t codepoint = codepoint1;

            // check if codepoint1 is a high surrogate
            if (codepoint1 >= 0xD800 and codepoint1 <= 0xDBFF)
            {
                // check if codepoint2 is a low surrogate
                if (codepoint2 >= 0xDC00 and codepoint2 <= 0xDFFF)
                {
                    codepoint =
                        // high surrogate occupies the most significant 22 bits
                        (codepoint1 << 10)
                        // low surrogate occupies the least significant 15 bits
                        + codepoint2
                        // there is still the 0xD800, 0xDC00 and 0x10000 noise
                        // in the result so we have to subtract with:
                        // (0xD800 << 10) + DC00 - 0x10000 = 0x35FDC00
                        - 0x35FDC00;
                }
                else
                {
                    JSON_THROW(std::invalid_argument("missing or wrong low surrogate"));
                }
            }

            string_t result;

            if (codepoint < 0x80)
            {
                // 1-byte characters: 0xxxxxxx (ASCII)
                result.append(1, static_cast<typename string_t::value_type>(codepoint));
            }
            else if (codepoint <= 0x7ff)
            {
                // 2-byte characters: 110xxxxx 10xxxxxx
                result.append(1, static_cast<typename string_t::value_type>(0xC0 | ((codepoint >> 6) & 0x1F)));
                result.append(1, static_cast<typename string_t::value_type>(0x80 | (codepoint & 0x3F)));
            }
            else if (codepoint <= 0xffff)
            {
                // 3-byte characters: 1110xxxx 10xxxxxx 10xxxxxx
                result.append(1, static_cast<typename string_t::value_type>(0xE0 | ((codepoint >> 12) & 0x0F)));
                result.append(1, static_cast<typename string_t::value_type>(0x80 | ((codepoint >> 6) & 0x3F)));
                result.append(1, static_cast<typename string_t::value_type>(0x80 | (codepoint & 0x3F)));
            }
            else if (codepoint <= 0x10ffff)
            {
                // 4-byte characters: 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
                result.append(1, static_cast<typename string_t::value_type>(0xF0 | ((codepoint >> 18) & 0x07)));
                result.append(1, static_cast<typename string_t::value_type>(0x80 | ((codepoint >> 12) & 0x3F)));
                result.append(1, static_cast<typename string_t::value_type>(0x80 | ((codepoint >> 6) & 0x3F)));
                result.append(1, static_cast<typename string_t::value_type>(0x80 | (codepoint & 0x3F)));
            }
            else
            {
                JSON_THROW(std::out_of_range("code points above 0x10FFFF are invalid"));
            }

            return result;
        }